

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void Frequent_BenchCmp<4u>(string *PATH)

{
  Abstract<4U> *this;
  pointer ppbVar1;
  int iVar2;
  ostream *poVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  WavingSketch<8U,_1U,_4U> *this_00;
  WavingSketch<8U,_16U,_4U> *this_01;
  SS<4U> *this_02;
  USS<4U> *this_03;
  Count_Heap<4U> *this_04;
  LdSketchWrapper<4U> *pLVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  allocator *paVar8;
  uint32_t i;
  pointer ppbVar9;
  uint uVar10;
  Data<4U> *pDVar11;
  uint32_t memory_size;
  int l;
  long lVar12;
  int j;
  long lVar13;
  uint32_t local_288;
  count_type cnt;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  Data<4U> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  int local_1f4;
  long local_1f0;
  string file;
  HashMap<4U> mp;
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_190;
  Abstract<4U> *sketches [6] [6];
  
  printf("\x1b[0m\x1b[1;4;33m# Testing function: BenchCmp\n\x1b[0m");
  cnt = 0;
  paVar8 = (allocator *)sketches;
  std::__cxx11::string::string((string *)&file,"caida",paVar8);
  local_240 = read_standard_data<4u>((PATH->_M_dataplus)._M_p,record_length,&cnt);
  poVar3 = std::operator<<((ostream *)&std::cout,"Total ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cnt);
  poVar3 = std::operator<<(poVar3," items");
  std::endl<char,std::char_traits<char>>(poVar3);
  mp._M_h._M_buckets = &mp._M_h._M_single_bucket;
  mp._M_h._M_bucket_count = 1;
  mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mp._M_h._M_element_count = 0;
  mp._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mp._M_h._M_rehash_policy._M_next_resize = 0;
  mp._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pDVar11 = local_240;
  for (lVar12 = 0; lVar12 < cnt; lVar12 = lVar12 + 1) {
    iVar4 = std::
            _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&mp._M_h,pDVar11);
    if (iVar4.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
        (__node_type *)0x0) {
      pmVar5 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&mp._M_h,pDVar11);
      *pmVar5 = 1;
    }
    else {
      pmVar5 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&mp._M_h,pDVar11);
      *pmVar5 = *pmVar5 + 1;
    }
    pDVar11 = pDVar11 + 1;
  }
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_190,&mp._M_h);
  iVar2 = Get_TopK<4u>((HashMap<4U> *)&local_190,2000);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_190);
  local_288 = 500;
  uVar10 = 30000;
  for (lVar12 = 0x28; lVar12 != 0x148; lVar12 = lVar12 + 0x30) {
    this_00 = (WavingSketch<8U,_1U,_4U> *)operator_new(0xa8);
    memory_size = uVar10 + 20000;
    WavingSketch<8U,_1U,_4U>::WavingSketch(this_00,memory_size / 0x42);
    *(WavingSketch<8U,_1U,_4U> **)((long)sketches[-1] + lVar12 + 8) = this_00;
    this_01 = (WavingSketch<8U,_16U,_4U> *)operator_new(0xa8);
    WavingSketch<8U,_16U,_4U>::WavingSketch(this_01,memory_size / 0x60);
    *(WavingSketch<8U,_16U,_4U> **)((long)sketches[-1] + lVar12 + 0x10) = this_01;
    this_02 = (SS<4U> *)operator_new(0x78);
    SS<4U>::SS(this_02,local_288);
    *(SS<4U> **)((long)sketches[-1] + lVar12 + 0x18) = this_02;
    this_03 = (USS<4U> *)operator_new(0x78);
    USS<4U>::USS(this_03,local_288);
    *(USS<4U> **)((long)sketches[-1] + lVar12 + 0x20) = this_03;
    this_04 = (Count_Heap<4U> *)operator_new(0x88);
    Count_Heap<4U>::Count_Heap(this_04,0x9c4,uVar10 / 0xc,3);
    *(Count_Heap<4U> **)((long)sketches[-1] + lVar12 + 0x28) = this_04;
    pLVar6 = (LdSketchWrapper<4U> *)operator_new(0x80);
    LdSketchWrapper<4U>::LdSketchWrapper(pLVar6,memory_size,iVar2);
    *(LdSketchWrapper<4U> **)((long)sketches[0] + lVar12) = pLVar6;
    local_288 = local_288 + 500;
    uVar10 = uVar10 + 50000;
  }
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector(&outs,4,(allocator_type *)&local_260);
  pbVar7 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+(&local_238,&RESULT_FOLDER_abi_cxx11_,"frequent_");
  std::operator+(&local_218,&local_238,&file);
  std::operator+(&local_260,&local_218,"_ARE.csv");
  std::ofstream::ofstream(pbVar7,(string *)&local_260,_S_out);
  *outs.
   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
   ._M_impl.super__Vector_impl_data._M_start = pbVar7;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  pbVar7 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+(&local_238,&RESULT_FOLDER_abi_cxx11_,"frequent_");
  std::operator+(&local_218,&local_238,&file);
  std::operator+(&local_260,&local_218,"_Recall Rate (RR).csv");
  std::ofstream::ofstream(pbVar7,(string *)&local_260,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = pbVar7;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  pbVar7 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+(&local_238,&RESULT_FOLDER_abi_cxx11_,"frequent_");
  std::operator+(&local_218,&local_238,&file);
  std::operator+(&local_260,&local_218,"_Precision Rate (PR).csv");
  std::ofstream::ofstream(pbVar7,(string *)&local_260,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = pbVar7;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  pbVar7 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  std::operator+(&local_238,&RESULT_FOLDER_abi_cxx11_,"frequent_");
  std::operator+(&local_218,&local_238,&file);
  std::operator+(&local_260,&local_218,"_F1.csv");
  std::ofstream::ofstream(pbVar7,(string *)&local_260,_S_out);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[3] = pbVar7;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  ppbVar1 = outs.
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_1f4 = iVar2;
  for (ppbVar9 = outs.
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar9 != ppbVar1;
      ppbVar9 = ppbVar9 + 1) {
    poVar3 = std::operator<<((ostream *)*ppbVar9,"MEM(KB)");
    std::operator<<(poVar3,",");
    for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
      poVar3 = std::operator<<((ostream *)*ppbVar9,(string *)&sketches[0][lVar12]->name);
      std::operator<<(poVar3,",");
    }
    std::endl<char,std::char_traits<char>>((ostream *)*ppbVar9);
  }
  lVar12 = 0;
  while (lVar12 != 6) {
    local_1f0 = lVar12 + 1;
    uVar10 = (int)local_1f0 * 0x32;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)uVar10);
    ppbVar1 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppbVar9 = outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppbVar9 != ppbVar1;
        ppbVar9 = ppbVar9 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar9,uVar10);
      std::operator<<(poVar3,",");
    }
    pLVar6 = (LdSketchWrapper<4U> *)sketches[lVar12][5];
    LdSketchWrapper<4U>::average_l(pLVar6);
    printf("Init average l: %lf\n");
    for (lVar12 = 0; lVar12 < cnt; lVar12 = lVar12 + 1) {
      pDVar11 = local_240 + lVar12;
      for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
        (**(code **)**(undefined8 **)(paVar8 + lVar13 * 8))
                  (*(undefined8 **)(paVar8 + lVar13 * 8),pDVar11);
      }
    }
    LdSketchWrapper<4U>::average_l(pLVar6);
    printf("After average l: %lf\n");
    iVar2 = local_1f4;
    for (lVar12 = 0;
        ppbVar1 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppbVar9 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar12 != 6; lVar12 = lVar12 + 1) {
      this = *(Abstract<4U> **)(paVar8 + lVar12 * 8);
      Abstract<4U>::Check(this,&mp,iVar2,&outs);
      (*this->_vptr_Abstract[9])(this);
    }
    for (; ppbVar9 != ppbVar1; ppbVar9 = ppbVar9 + 1) {
      std::endl<char,std::char_traits<char>>((ostream *)*ppbVar9);
    }
    paVar8 = paVar8 + 0x30;
    lVar12 = local_1f0;
  }
  operator_delete(local_240,4);
  std::
  _Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~_Vector_base(&outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 );
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&mp._M_h);
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void Frequent_BenchCmp(std::string PATH) {
	printf("\033[0m\033[1;4;33m# Testing function: BenchCmp\n\033[0m");
	count_type cnt = 0;
	Data<DATA_LEN>* items = NULL;
	std::string file = "caida";

	items = read_standard_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
	std::cout << "Total " << cnt << " items" << std::endl;
	int32_t mem_base = 0;
	int32_t mem_inc = 50000;
	constexpr int32_t mem_var = 6;
	constexpr int32_t cmp_num = 6;
	int heap_size = 2500, K = 2000;
	// constexpr int32_t num_inc = 10;
	int nshrink = 0;
	// Ground truth
	HashMap<DATA_LEN> mp;
	for (int l = 0; l < cnt; ++l) {
		if (mp.find(items[l]) == mp.end())
			mp[items[l]] = 1;
		else
			mp[items[l]] += 1;
	}
	uint32_t topK = Get_TopK(mp, K);

	Abstract<DATA_LEN>* sketches[mem_var][cmp_num];

	for (int i = 0; i < mem_var; ++i) {
		int memory = (mem_base + mem_inc * (i + 1));
		sketches[i][0] = new WavingSketch<8, 1, DATA_LEN>(memory / (8 * 8 + 1 * 2));
		sketches[i][1] = new WavingSketch<8, 16, DATA_LEN>(memory / (8 * 8 + 16 * 2));
		sketches[i][2] = new SS<DATA_LEN>(memory / 100);
		sketches[i][3] = new USS<DATA_LEN>(memory / 100);
		sketches[i][4] = new Count_Heap<DATA_LEN>(heap_size, (memory - heap_size * (sizeof(Data<DATA_LEN>) + 4)) / 12, 3);
		sketches[i][5] = new LdSketchWrapper<DATA_LEN>(memory, topK);
	}

	std::vector<std::ostream*> outs(4);
	outs[0] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "frequent_" + file + "_F1.csv");

	for (auto& out : outs)
	{
		*out << "MEM(KB)" << ",";
		for (uint32_t i = 0; i < cmp_num; i++)
		{
			*out << sketches[0][i]->name << ",";
		}
		*out << std::endl;
	}

	for (int i = 0; i < mem_var; ++i) {
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m",
			(mem_base + mem_inc * (i + 1)) / 1000);
		for (auto& out : outs)
		{
			*out << (mem_base + mem_inc * (i + 1)) / 1000 << ",";
		}
		printf("Init average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][5])->average_l());
		for (int l = 0; l < cnt; ++l) {
			for (int j = 0; j < cmp_num; ++j) {
				sketches[i][j]->Init(items[l]);
			}
		}
		printf("After average l: %lf\n",
			((LdSketchWrapper<DATA_LEN>*)sketches[i][5])->average_l());

		for (int j = 0; j < cmp_num; ++j) {
			sketches[i][j]->Check(mp, topK, outs);
			delete sketches[i][j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}

	delete items;
}